

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

uint __thiscall glslang::TSmallArrayVector::getDimSize(TSmallArrayVector *this,int i)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  int i_local;
  TSmallArrayVector *this_local;
  
  bVar1 = false;
  if (this->sizes != (TVector<glslang::TArraySize> *)0x0) {
    sVar2 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::size
                      (&this->sizes->
                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                      );
    bVar1 = i < (int)sVar2;
  }
  if (!bVar1) {
    __assert_fail("sizes != nullptr && (int)sizes->size() > i",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                  ,0xae,"unsigned int glslang::TSmallArrayVector::getDimSize(int) const");
  }
  pvVar3 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::
           operator[](&this->sizes->
                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                      ,(long)i);
  return pvVar3->size;
}

Assistant:

unsigned int getDimSize(int i) const
    {
        assert(sizes != nullptr && (int)sizes->size() > i);
        return (*sizes)[i].size;
    }